

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O1

void __thiscall smf::Option_register::reset(Option_register *this)

{
  (this->definition)._M_string_length = 0;
  *(this->definition)._M_dataplus._M_p = '\0';
  (this->defaultOption)._M_string_length = 0;
  *(this->defaultOption)._M_dataplus._M_p = '\0';
  (this->modifiedOption)._M_string_length = 0;
  *(this->modifiedOption)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void Option_register::reset(void) {
   definition.clear();
   defaultOption.clear();
   modifiedOption.clear();
}